

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O0

positionTy * GetAirportLoc(string *sICAO)

{
  bool bVar1;
  positionTy *in_RDI;
  XPLMNavRef navRef;
  float alt;
  float lon;
  float lat;
  char sId [32];
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  int local_38;
  float local_30;
  float local_2c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  local_2c = NAN;
  local_30 = NAN;
  local_38 = XPLMFindFirstNavAidOfType(1);
  while( true ) {
    if (local_38 == -1) {
      positionTy::positionTy(in_RDI);
      return in_RDI;
    }
    __lhs = &local_28;
    __rhs = (char *)0x0;
    XPLMGetNavAidInfo(local_38,0,&local_2c,&local_30);
    bVar1 = std::operator==(__lhs,__rhs);
    if (bVar1) break;
    local_38 = XPLMGetNextNavAid(local_38);
  }
  positionTy::positionTy
            (in_RDI,(double)local_2c,(double)local_30,NAN,NAN,NAN,NAN,NAN,GND_UNKNOWN,UNIT_WORLD,
             UNIT_DEG,FPH_UNKNOWN);
  return in_RDI;
}

Assistant:

positionTy GetAirportLoc (const std::string sICAO)
{
    char sId[32];
    float lat=NAN, lon=NAN, alt=NAN;

    // Loop all airorts
    for (XPLMNavRef navRef = XPLMFindFirstNavAidOfType(xplm_Nav_Airport);
         navRef != XPLM_NAV_NOT_FOUND;
         navRef = XPLMGetNextNavAid(navRef))
    {
        // Get info and check if this is the one
        XPLMGetNavAidInfo(navRef, nullptr,
                          &lat, &lon, &alt,
                          nullptr, nullptr, sId, nullptr, nullptr);
        if (sICAO == sId)
            return positionTy(lat, lon, alt);
    }
    // not found
    return positionTy();
}